

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGTexture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmXe_LPGTextureCalc::SetPlanarOffsetInfo
          (GmmXe_LPGTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,
          GMM_RESCREATE_CUSTOM_PARAMS *CreateParams)

{
  GMM_PLATFORM_INFO *pGVar1;
  byte local_29;
  uint8_t i;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_RESCREATE_CUSTOM_PARAMS *CreateParams_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmXe_LPGTextureCalc *this_local;
  
  pGVar1 = GmmGetPlatformInfo((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                              super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                              super_GmmTextureCalc.pGmmLibContext);
  if (pGVar1->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
    (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.IsTileAlignedPlanes = true;
  }
  for (local_29 = 1; (uint)local_29 <= CreateParams->NoOfPlanes; local_29 = local_29 + 1) {
    *(ulong *)(pTexInfo->MmcHint + (ulong)local_29 * 8 + 0x78) =
         (ulong)(CreateParams->PlaneOffset).X[local_29];
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + (ulong)local_29 * 8 + 0x28) =
         (ulong)(CreateParams->PlaneOffset).Y[local_29];
  }
  (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = CreateParams->NoOfPlanes;
  return;
}

Assistant:

void GmmLib::GmmXe_LPGTextureCalc::SetPlanarOffsetInfo(GMM_TEXTURE_INFO *pTexInfo, GMM_RESCREATE_CUSTOM_PARAMS &CreateParams)
{
    const GMM_PLATFORM_INFO *pPlatform;
    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        pTexInfo->OffsetInfo.PlaneXe_LPG.IsTileAlignedPlanes = true;
    }
    for(uint8_t i = 1; i <= CreateParams.NoOfPlanes; i++)
    {
        pTexInfo->OffsetInfo.PlaneXe_LPG.X[i] = CreateParams.PlaneOffset.X[i];
        pTexInfo->OffsetInfo.PlaneXe_LPG.Y[i] = CreateParams.PlaneOffset.Y[i];
    }
    pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = CreateParams.NoOfPlanes;
}